

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaTreeItemPtr_conflict
xmlSchemaParseModelGroupDefRef(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  _xmlAttr *p_Var1;
  int iVar2;
  uint min;
  int iVar3;
  xmlNodePtr pxVar4;
  xmlSchemaParticlePtr pxVar5;
  xmlSchemaQNameRefPtr pxVar6;
  xmlSchemaAnnotPtr pxVar7;
  xmlNodePtr in_RCX;
  xmlAttrPtr attr;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr pxVar8;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  char *in_R8;
  xmlChar **uri;
  char *pcVar9;
  xmlChar **in_R9;
  _xmlAttr **pp_Var10;
  char *in_stack_ffffffffffffffa8;
  xmlChar *refNs;
  xmlChar *ref;
  xmlChar *local_38;
  
  ref = (xmlChar *)0x0;
  refNs = (xmlChar *)0x0;
  if (node != (xmlNodePtr)0x0) {
    pxVar4 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
    if (pxVar4 == (xmlNodePtr)0x0) {
      xmlSchemaPMissingAttrErr
                (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1f17a3,in_RCX,in_R8,
                 (char *)in_R9);
    }
    else {
      uri = &ref;
      iVar2 = xmlSchemaPValAttrNodeQName
                        (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar4,(xmlAttrPtr)&refNs,uri,in_R9);
      if (iVar2 == 0) {
        local_38 = refNs;
        xmlSchemaCheckReference(ctxt,(xmlSchemaPtr)node,pxVar4,(xmlAttrPtr)refNs,(xmlChar *)uri);
        min = xmlGetMinOccurs(ctxt,node,-1,0x1f869e,(int)uri,(char *)in_R9);
        pcVar9 = "(xs:nonNegativeInteger | unbounded)";
        attr = (xmlAttrPtr)&DAT_40000000;
        iVar2 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x1f86b4,(char *)in_R9);
        pp_Var10 = &node->properties;
        pxVar8 = extraout_RDX;
        while( true ) {
          iVar3 = (int)pcVar9;
          p_Var1 = *pp_Var10;
          if (p_Var1 == (_xmlAttr *)0x0) break;
          if (p_Var1->ns == (xmlNs *)0x0) {
            iVar3 = xmlStrEqual(p_Var1->name,"ref");
            pxVar8 = extraout_RDX_02;
            if (((iVar3 == 0) &&
                (iVar3 = xmlStrEqual(p_Var1->name,"id"), pxVar8 = extraout_RDX_03, iVar3 == 0)) &&
               ((iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"minOccurs"), pxVar8 = extraout_RDX_04,
                iVar3 == 0 &&
                (iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"maxOccurs"), pxVar8 = extraout_RDX_05,
                iVar3 == 0)))) goto LAB_001b68b4;
          }
          else {
            iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            pxVar8 = extraout_RDX_00;
            if (iVar3 != 0) {
LAB_001b68b4:
              xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar8,attr);
              pxVar8 = extraout_RDX_01;
            }
          }
          pp_Var10 = &p_Var1->next;
        }
        xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar8);
        pxVar5 = xmlSchemaAddParticle(ctxt,node,min,iVar2);
        if (pxVar5 != (xmlSchemaParticlePtr)0x0) {
          pxVar6 = xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_GROUP,ref,local_38);
          pxVar5->children = (xmlSchemaTreeItemPtr_conflict)pxVar6;
          xmlSchemaPCheckParticleCorrect_2
                    (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)min,iVar2,iVar3);
          pxVar4 = node->children;
          if (pxVar4 != (xmlNodePtr)0x0) {
            if (((pxVar4->ns != (xmlNs *)0x0) &&
                (iVar3 = xmlStrEqual(pxVar4->name,"annotation"), iVar3 != 0)) &&
               (iVar3 = xmlStrEqual(pxVar4->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
               iVar3 != 0)) {
              pxVar7 = xmlSchemaParseAnnotation(ctxt,pxVar4,1);
              pxVar5->annot = pxVar7;
              pxVar4 = pxVar4->next;
              if (pxVar4 == (_xmlNode *)0x0) goto LAB_001b6a02;
            }
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,pxVar4,
                       (xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffffa8);
          }
LAB_001b6a02:
          if (min != 0 || iVar2 != 0) {
            return (xmlSchemaTreeItemPtr_conflict)pxVar5;
          }
          return (xmlSchemaTreeItemPtr_conflict)0x0;
        }
      }
    }
  }
  return (xmlSchemaTreeItemPtr_conflict)0x0;
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaParseModelGroupDefRef(xmlSchemaParserCtxtPtr ctxt,
			       xmlSchemaPtr schema,
			       xmlNodePtr node)
{
    xmlSchemaParticlePtr item;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *ref = NULL, *refNs = NULL;
    int min, max;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "ref");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "ref", NULL);
	return (NULL);
    } else if (xmlSchemaPValAttrNodeQName(ctxt, schema, NULL,
	attr, &refNs, &ref) != 0) {
	return (NULL);
    }
    xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
	"(xs:nonNegativeInteger | unbounded)");
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "ref")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "maxOccurs"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    item = xmlSchemaAddParticle(ctxt, node, min, max);
    if (item == NULL)
	return (NULL);
    /*
    * Create a qname-reference and set as the term; it will be substituted
    * for the model group after the reference has been resolved.
    */
    item->children = (xmlSchemaTreeItemPtr)
	xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_GROUP, ref, refNs);
    xmlSchemaPCheckParticleCorrect_2(ctxt, item, node, min, max);
    /*
    * And now for the children...
    */
    child = node->children;
    /* TODO: Is annotation even allowed for a model group reference? */
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* TODO: What to do exactly with the annotation?
	*/
	item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?)");
    }
    /*
    * Corresponds to no component at all if minOccurs==maxOccurs==0.
    */
    if ((min == 0) && (max == 0))
	return (NULL);

    return ((xmlSchemaTreeItemPtr) item);
}